

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_diag_sse2_128_32.c
# Opt level: O1

parasail_result_t *
parasail_nw_table_diag_sse2_128_32
          (char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,parasail_matrix_t *matrix)

{
  int iVar1;
  int *piVar2;
  int *piVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  int iVar6;
  int iVar7;
  parasail_result_t *ppVar8;
  int32_t *ptr;
  int32_t *ptr_00;
  int32_t *ptr_01;
  int32_t *ptr_02;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  int iVar13;
  uint uVar14;
  ulong uVar15;
  ulong uVar16;
  int iVar17;
  ulong uVar18;
  uint uVar19;
  uint uVar20;
  ulong uVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  ulong uVar25;
  int iVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  __m128i_32_t A_3;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  uint uVar32;
  uint uVar33;
  uint uVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  int iVar41;
  int iVar42;
  int iVar43;
  int iVar44;
  int iVar48;
  int iVar49;
  __m128i_32_t A;
  int iVar50;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  int iVar51;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  int iVar54;
  int iVar55;
  int iVar56;
  int32_t iVar57;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  uint local_16c;
  long local_140;
  int local_f8;
  int iStack_f4;
  int iStack_f0;
  int iStack_ec;
  long local_e0;
  long local_d8;
  long local_d0;
  
  if (_s2 == (char *)0x0) {
    parasail_nw_table_diag_sse2_128_32_cold_7();
  }
  else if (s2Len < 1) {
    parasail_nw_table_diag_sse2_128_32_cold_6();
  }
  else if (open < 0) {
    parasail_nw_table_diag_sse2_128_32_cold_5();
  }
  else if (gap < 0) {
    parasail_nw_table_diag_sse2_128_32_cold_4();
  }
  else if (matrix == (parasail_matrix_t *)0x0) {
    parasail_nw_table_diag_sse2_128_32_cold_3();
  }
  else {
    if (matrix->type == 0) {
      if (_s1 == (char *)0x0) {
        parasail_nw_table_diag_sse2_128_32_cold_2();
        return (parasail_result_t *)0x0;
      }
      uVar15 = (ulong)(uint)_s1Len;
      if (_s1Len < 1) {
        parasail_nw_table_diag_sse2_128_32_cold_1();
        return (parasail_result_t *)0x0;
      }
    }
    else {
      uVar15 = (ulong)(uint)matrix->length;
    }
    iVar13 = -open;
    iVar26 = matrix->min;
    uVar32 = 0x80000000 - iVar26;
    if (iVar26 != iVar13 && SBORROW4(iVar26,iVar13) == iVar26 + open < 0) {
      uVar32 = open | 0x80000000;
    }
    iVar26 = 0x7ffffffe - matrix->max;
    uVar33 = (uint)uVar15;
    ppVar8 = parasail_result_new_table1(uVar33,s2Len);
    if (ppVar8 != (parasail_result_t *)0x0) {
      ppVar8->flag = ppVar8->flag | 0x4421001;
      uVar16 = (ulong)(s2Len + 6);
      ptr = parasail_memalign_int32_t(0x10,uVar16);
      ptr_00 = parasail_memalign_int32_t(0x10,uVar16);
      ptr_01 = parasail_memalign_int32_t(0x10,uVar16);
      if (ptr_01 != (int32_t *)0x0 && (ptr_00 != (int32_t *)0x0 && ptr != (int32_t *)0x0)) {
        if (matrix->type == 0) {
          iVar6 = uVar33 + 3;
          ptr_02 = parasail_memalign_int32_t(0x10,(long)iVar6);
          if (ptr_02 == (int32_t *)0x0) {
            return (parasail_result_t *)0x0;
          }
          if (0 < (int)uVar33) {
            piVar2 = matrix->mapper;
            uVar16 = 0;
            do {
              ptr_02[uVar16] = piVar2[(byte)_s1[uVar16]];
              uVar16 = uVar16 + 1;
            } while (uVar15 != uVar16);
          }
          iVar17 = uVar33 + 1;
          if ((int)(uVar33 + 1) < iVar6) {
            iVar17 = iVar6;
          }
          memset(ptr_02 + (int)uVar33,0,(ulong)(~uVar33 + iVar17) * 4 + 4);
        }
        else {
          ptr_02 = (int32_t *)0x0;
        }
        uVar23 = s2Len + 3;
        local_16c = uVar33 - 1;
        iVar6 = s2Len + -1;
        iVar17 = uVar32 + 1;
        iStack_f0 = iVar13 - gap;
        iStack_f4 = iVar13 + gap * -2;
        local_f8 = -(gap * 3 + open);
        piVar2 = matrix->mapper;
        uVar16 = 1;
        if (1 < s2Len) {
          uVar16 = (ulong)(uint)s2Len;
        }
        uVar12 = 0;
        do {
          ptr[uVar12 + 3] = piVar2[(byte)_s2[uVar12]];
          uVar12 = uVar12 + 1;
        } while (uVar16 != uVar12);
        ptr[2] = 0;
        ptr[0] = 0;
        ptr[1] = 0;
        uVar12 = (ulong)(uint)s2Len;
        uVar32 = s2Len + 1U;
        if ((int)(s2Len + 1U) < (int)uVar23) {
          uVar32 = uVar23;
        }
        uVar18 = 0;
        memset(ptr + uVar12 + 3,0,(ulong)(~s2Len + uVar32) * 4 + 4);
        iVar7 = iVar13;
        do {
          ptr_00[uVar18 + 3] = iVar7;
          ptr_01[uVar18 + 3] = iVar17;
          uVar18 = uVar18 + 1;
          iVar7 = iVar7 - gap;
        } while (uVar16 != uVar18);
        lVar9 = 0;
        do {
          ptr_00[lVar9] = iVar17;
          ptr_01[lVar9] = iVar17;
          lVar9 = lVar9 + 1;
        } while (lVar9 != 3);
        lVar9 = uVar12 + 3;
        do {
          ptr_00[lVar9] = iVar17;
          ptr_01[lVar9] = iVar17;
          lVar9 = lVar9 + 1;
          s2Len = s2Len + 1;
        } while (s2Len < (int)uVar23);
        ptr_00[2] = 0;
        auVar27._4_4_ = iVar17;
        auVar27._0_4_ = iVar17;
        auVar27._8_4_ = iVar17;
        auVar27._12_4_ = iVar17;
        auVar38._4_4_ = iVar26;
        auVar38._0_4_ = iVar26;
        auVar38._8_4_ = iVar26;
        auVar38._12_4_ = iVar26;
        auVar29 = auVar27;
        if (0 < (int)uVar33) {
          piVar2 = matrix->matrix;
          auVar4._4_4_ = iVar17;
          auVar4._0_4_ = iVar17;
          auVar4._8_4_ = iVar17;
          auVar4._12_4_ = iVar17;
          uVar16 = 1;
          if (1 < (int)uVar23) {
            uVar16 = (ulong)uVar23;
          }
          lVar9 = uVar12 * 0x10;
          local_140 = uVar12 * 4 + -4;
          local_d8 = uVar12 * 0xc + -0xc;
          local_e0 = uVar12 * 8 + -8;
          uVar32 = 3;
          uVar33 = 2;
          uVar23 = 1;
          uVar34 = 0;
          local_d0 = 0;
          uVar18 = 0;
          auVar27 = auVar4;
          auVar29 = auVar4;
          iStack_ec = iVar13;
          do {
            iVar7 = matrix->type;
            uVar20 = (uint)uVar18;
            uVar19 = uVar20;
            if (iVar7 == 0) {
              uVar19 = ptr_02[uVar18];
            }
            uVar10 = uVar18 | 1;
            if (iVar7 == 0) {
              uVar22 = ptr_02[uVar10];
            }
            else {
              uVar22 = local_16c;
              if (uVar10 < uVar15) {
                uVar22 = uVar20 | 1;
              }
            }
            uVar25 = uVar18 | 2;
            if (iVar7 == 0) {
              uVar24 = ptr_02[uVar25];
            }
            else {
              uVar24 = local_16c;
              if (uVar25 < uVar15) {
                uVar24 = uVar20 | 2;
              }
            }
            uVar11 = uVar18 | 3;
            if (iVar7 == 0) {
              uVar14 = ptr_02[uVar11];
            }
            else {
              uVar14 = local_16c;
              if (uVar11 < uVar15) {
                uVar14 = uVar20 | 3;
              }
            }
            iVar7 = matrix->size;
            uVar18 = uVar18 + 4;
            iVar57 = ptr_00[2];
            ptr_00[2] = iVar13 - (int)uVar18 * gap;
            auVar47._0_12_ = auVar4._4_12_;
            auVar47._12_4_ = iVar13 - uVar20 * gap;
            auVar40._0_4_ = -(uint)(uVar32 == local_16c);
            auVar40._4_4_ = -(uint)(uVar33 == local_16c);
            auVar40._8_4_ = -(uint)(uVar23 == local_16c);
            auVar40._12_4_ = -(uint)(uVar34 == local_16c);
            uVar21 = 0;
            iVar41 = -3;
            iVar42 = -2;
            iVar43 = -1;
            iVar44 = 0;
            auVar46._4_4_ = iVar17;
            auVar46._0_4_ = iVar17;
            auVar46._8_4_ = iVar17;
            auVar46._12_4_ = iVar17;
            iVar54 = iVar17;
            iVar55 = iVar17;
            iVar56 = iVar17;
            auVar63 = auVar46;
            do {
              iVar1 = ptr_00[uVar21 + 3];
              iVar48 = auVar47._4_4_;
              iVar49 = auVar47._8_4_;
              iVar50 = auVar47._12_4_;
              auVar35._0_4_ = piVar2[(long)(int)(uVar14 * iVar7) + (long)ptr[uVar21]] + iVar54;
              auVar35._4_4_ = piVar2[(long)(int)(uVar24 * iVar7) + (long)ptr[uVar21 + 1]] + iVar55;
              auVar35._8_4_ = piVar2[(long)(int)(uVar22 * iVar7) + (long)ptr[uVar21 + 2]] + iVar56;
              auVar35._12_4_ = piVar2[(long)(int)(uVar19 * iVar7) + (long)ptr[uVar21 + 3]] + iVar57;
              auVar59._0_4_ = iVar48 - open;
              auVar59._4_4_ = iVar49 - open;
              auVar59._8_4_ = iVar50 - open;
              auVar59._12_4_ = iVar1 - open;
              auVar62._0_4_ = auVar63._4_4_ - gap;
              auVar62._4_4_ = auVar63._8_4_ - gap;
              auVar62._8_4_ = auVar63._12_4_ - gap;
              auVar62._12_4_ = ptr_01[uVar21 + 3] - gap;
              auVar58._0_4_ = -(uint)(auVar62._0_4_ < auVar59._0_4_);
              auVar58._4_4_ = -(uint)(auVar62._4_4_ < auVar59._4_4_);
              auVar58._8_4_ = -(uint)(auVar62._8_4_ < auVar59._8_4_);
              auVar58._12_4_ = -(uint)(auVar62._12_4_ < auVar59._12_4_);
              auVar58 = ~auVar58 & auVar62 | auVar59 & auVar58;
              auVar61._0_4_ = auVar47._0_4_ - open;
              auVar61._4_4_ = iVar48 - open;
              auVar61._8_4_ = iVar49 - open;
              auVar61._12_4_ = iVar50 - open;
              auVar52._0_4_ = auVar46._0_4_ - gap;
              auVar52._4_4_ = auVar46._4_4_ - gap;
              auVar52._8_4_ = auVar46._8_4_ - gap;
              auVar52._12_4_ = auVar46._12_4_ - gap;
              auVar60._0_4_ = -(uint)(auVar52._0_4_ < auVar61._0_4_);
              auVar60._4_4_ = -(uint)(auVar52._4_4_ < auVar61._4_4_);
              auVar60._8_4_ = -(uint)(auVar52._8_4_ < auVar61._8_4_);
              auVar60._12_4_ = -(uint)(auVar52._12_4_ < auVar61._12_4_);
              auVar61 = ~auVar60 & auVar52 | auVar61 & auVar60;
              auVar45._0_4_ = -(uint)(auVar61._0_4_ < auVar35._0_4_);
              auVar45._4_4_ = -(uint)(auVar61._4_4_ < auVar35._4_4_);
              auVar45._8_4_ = -(uint)(auVar61._8_4_ < auVar35._8_4_);
              auVar45._12_4_ = -(uint)(auVar61._12_4_ < auVar35._12_4_);
              auVar46 = ~auVar45 & auVar61 | auVar35 & auVar45;
              auVar36._0_4_ = -(uint)(auVar58._0_4_ < auVar46._0_4_);
              auVar36._4_4_ = -(uint)(auVar58._4_4_ < auVar46._4_4_);
              auVar36._8_4_ = -(uint)(auVar58._8_4_ < auVar46._8_4_);
              auVar36._12_4_ = -(uint)(auVar58._12_4_ < auVar46._12_4_);
              auVar53._0_4_ = -(uint)(iVar41 == -1);
              auVar53._4_4_ = -(uint)(iVar42 == -1);
              auVar53._8_4_ = -(uint)(iVar43 == -1);
              auVar53._12_4_ = -(uint)(iVar44 == -1);
              auVar63._4_4_ = iStack_f4;
              auVar63._0_4_ = local_f8;
              auVar63._8_4_ = iStack_f0;
              auVar63._12_4_ = iStack_ec;
              auVar47 = auVar63 & auVar53 | ~auVar53 & (~auVar36 & auVar58 | auVar46 & auVar36);
              iVar54 = auVar47._0_4_;
              iVar55 = auVar47._4_4_;
              iVar56 = auVar47._8_4_;
              iVar51 = auVar47._12_4_;
              if (3 < uVar21) {
                auVar37._0_4_ = -(uint)(iVar54 < auVar38._0_4_);
                auVar37._4_4_ = -(uint)(iVar55 < auVar38._4_4_);
                auVar37._8_4_ = -(uint)(iVar56 < auVar38._8_4_);
                auVar37._12_4_ = -(uint)(iVar51 < auVar38._12_4_);
                auVar38 = ~auVar37 & auVar38 | auVar47 & auVar37;
                auVar31._0_4_ = -(uint)(iVar54 < auVar27._0_4_);
                auVar31._4_4_ = -(uint)(iVar55 < auVar27._4_4_);
                auVar31._8_4_ = -(uint)(iVar56 < auVar27._8_4_);
                auVar31._12_4_ = -(uint)(iVar51 < auVar27._12_4_);
                auVar27 = auVar27 & auVar31 | ~auVar31 & auVar47;
              }
              piVar3 = ((ppVar8->field_4).rowcols)->score_row;
              if (uVar21 < uVar12) {
                *(int *)((long)piVar3 + uVar21 * 4 + local_d0) = iVar51;
              }
              if (uVar21 - 1 < uVar12 && uVar10 < uVar15) {
                *(int *)((long)piVar3 + uVar21 * 4 + local_140) = iVar56;
              }
              if ((uVar25 < uVar15) && ((long)(uVar21 - 2) < (long)uVar12 && 1 < uVar21)) {
                *(int *)((long)piVar3 + uVar21 * 4 + local_e0) = iVar55;
              }
              if ((uVar11 < uVar15) && ((long)(uVar21 - 3) < (long)uVar12 && 2 < uVar21)) {
                *(int *)((long)piVar3 + uVar21 * 4 + local_d8) = iVar54;
              }
              auVar5._4_4_ = iVar17;
              auVar5._0_4_ = iVar17;
              auVar5._8_4_ = iVar17;
              auVar5._12_4_ = iVar17;
              auVar63 = ~auVar53 & auVar58 | auVar5 & auVar53;
              auVar46 = ~auVar53 & auVar61 | auVar5 & auVar53;
              ptr_00[uVar21] = iVar54;
              ptr_01[uVar21] = auVar63._0_4_;
              auVar39._0_4_ = -(uint)(iVar41 == iVar6);
              auVar39._4_4_ = -(uint)(iVar42 == iVar6);
              auVar39._8_4_ = -(uint)(iVar43 == iVar6);
              auVar39._12_4_ = -(uint)(iVar44 == iVar6);
              auVar29 = ~(auVar39 & auVar40) & auVar29 | auVar47 & auVar39 & auVar40;
              iVar41 = iVar41 + 1;
              iVar42 = iVar42 + 1;
              iVar43 = iVar43 + 1;
              iVar44 = iVar44 + 1;
              uVar21 = uVar21 + 1;
              iVar54 = iVar48;
              iVar55 = iVar49;
              iVar56 = iVar50;
              iVar57 = iVar1;
            } while (uVar16 != uVar21);
            uVar32 = uVar32 + 4;
            uVar33 = uVar33 + 4;
            uVar23 = uVar23 + 4;
            uVar34 = uVar34 + 4;
            local_f8 = local_f8 + gap * -4;
            iStack_f4 = iStack_f4 + gap * -4;
            iStack_f0 = iStack_f0 + gap * -4;
            iStack_ec = iStack_ec + gap * -4;
            local_d0 = local_d0 + lVar9;
            local_140 = local_140 + lVar9;
            local_d8 = local_d8 + lVar9;
            local_e0 = local_e0 + lVar9;
          } while (uVar18 < uVar15);
        }
        iVar7 = 4;
        iVar13 = iVar17;
        do {
          if (iVar13 < auVar29._12_4_) {
            iVar13 = auVar29._12_4_;
          }
          lVar9 = auVar29._8_8_;
          uVar15 = auVar29._0_8_;
          auVar29._0_8_ = uVar15 << 0x20;
          auVar29._8_8_ = lVar9 << 0x20 | uVar15 >> 0x20;
          iVar7 = iVar7 + -1;
        } while (iVar7 != 0);
        auVar30._0_4_ = -(uint)(auVar38._0_4_ < iVar17);
        auVar30._4_4_ = -(uint)(auVar38._4_4_ < iVar17);
        auVar30._8_4_ = -(uint)(auVar38._8_4_ < iVar17);
        auVar30._12_4_ = -(uint)(auVar38._12_4_ < iVar17);
        auVar28._0_4_ = -(uint)(iVar26 < auVar27._0_4_);
        auVar28._4_4_ = -(uint)(iVar26 < auVar27._4_4_);
        auVar28._8_4_ = -(uint)(iVar26 < auVar27._8_4_);
        auVar28._12_4_ = -(uint)(iVar26 < auVar27._12_4_);
        iVar26 = movmskps(0,auVar28 | auVar30);
        if (iVar26 != 0) {
          *(byte *)&ppVar8->flag = (byte)ppVar8->flag | 0x40;
          iVar13 = 0;
          iVar6 = 0;
          local_16c = 0;
        }
        ppVar8->score = iVar13;
        ppVar8->end_query = local_16c;
        ppVar8->end_ref = iVar6;
        parasail_free(ptr_01);
        parasail_free(ptr_00);
        parasail_free(ptr);
        if (matrix->type == 0) {
          parasail_free(ptr_02);
          return ppVar8;
        }
        return ppVar8;
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* FNAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix)
{
    /* declare local variables */
    int32_t N = 0;
    int32_t PAD = 0;
    int32_t PAD2 = 0;
    int32_t s1Len = 0;
    int32_t s1Len_PAD = 0;
    int32_t s2Len_PAD = 0;
    int32_t * restrict s1 = NULL;
    int32_t * restrict s2B = NULL;
    int32_t * restrict _H_pr = NULL;
    int32_t * restrict _F_pr = NULL;
    int32_t * restrict s2 = NULL;
    int32_t * restrict H_pr = NULL;
    int32_t * restrict F_pr = NULL;
    parasail_result_t *result = NULL;
    int32_t i = 0;
    int32_t j = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t NEG_LIMIT = 0;
    int32_t POS_LIMIT = 0;
    int32_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vNegInf;
    __m128i vOpen;
    __m128i vGap;
    __m128i vOne;
    __m128i vN;
    __m128i vGapN;
    __m128i vNegOne;
    __m128i vI;
    __m128i vJreset;
    __m128i vMax;
    __m128i vILimit;
    __m128i vILimit1;
    __m128i vJLimit;
    __m128i vJLimit1;
    __m128i vIBoundary;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    N = 4; /* number of values in vector */
    PAD = N-1;
    PAD2 = PAD*2;
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    s1Len_PAD = s1Len+PAD;
    s2Len_PAD = s2Len+PAD;
    i = 0;
    j = 0;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    NEG_LIMIT = (-open < matrix->min ? INT32_MIN + open : INT32_MIN - matrix->min) + 1;
    POS_LIMIT = INT32_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi32(NEG_LIMIT);
    vPosLimit = _mm_set1_epi32(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInf = _mm_set1_epi32(NEG_LIMIT);
    vOpen = _mm_set1_epi32(open);
    vGap  = _mm_set1_epi32(gap);
    vOne = _mm_set1_epi32(1);
    vN = _mm_set1_epi32(N);
    vGapN = _mm_set1_epi32(gap*N);
    vNegOne = _mm_set1_epi32(-1);
    vI = _mm_set_epi32(0,1,2,3);
    vJreset = _mm_set_epi32(0,-1,-2,-3);
    vMax = vNegInf;
    vILimit = _mm_set1_epi32(s1Len);
    vILimit1 = _mm_sub_epi32(vILimit, vOne);
    vJLimit = _mm_set1_epi32(s2Len);
    vJLimit1 = _mm_sub_epi32(vJLimit, vOne);
    vIBoundary = _mm_set_epi32(
            -open-0*gap,
            -open-1*gap,
            -open-2*gap,
            -open-3*gap);

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(s1Len, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(s1Len, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_DIAG
        | PARASAIL_FLAG_BITS_32 | PARASAIL_FLAG_LANES_4;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    s2B= parasail_memalign_int32_t(16, s2Len+PAD2);
    _H_pr = parasail_memalign_int32_t(16, s2Len+PAD2);
    _F_pr = parasail_memalign_int32_t(16, s2Len+PAD2);
    s2 = s2B+PAD; /* will allow later for negative indices */
    H_pr = _H_pr+PAD;
    F_pr = _F_pr+PAD;

    /* validate heap variables */
    if (!s2B) return NULL;
    if (!_H_pr) return NULL;
    if (!_F_pr) return NULL;

    /* convert _s1 from char to int in range 0-23 */
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        s1 = parasail_memalign_int32_t(16, s1Len+PAD);
        if (!s1) return NULL;
        for (i=0; i<s1Len; ++i) {
            s1[i] = matrix->mapper[(unsigned char)_s1[i]];
        }
        /* pad back of s1 with dummy values */
        for (i=s1Len; i<s1Len_PAD; ++i) {
            s1[i] = 0; /* point to first matrix row because we don't care */
        }
    }

    /* convert _s2 from char to int in range 0-23 */
    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }
    /* pad front of s2 with dummy values */
    for (j=-PAD; j<0; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }
    /* pad back of s2 with dummy values */
    for (j=s2Len; j<s2Len_PAD; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }

    /* set initial values for stored row */
    for (j=0; j<s2Len; ++j) {
        H_pr[j] = -open - j*gap;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad front of stored row values */
    for (j=-PAD; j<0; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad back of stored row values */
    for (j=s2Len; j<s2Len+PAD; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }
    H_pr[-1] = 0; /* upper left corner */

    /* iterate over query sequence */
    for (i=0; i<s1Len; i+=N) {
        __m128i vNH = vNegInf;
        __m128i vWH = vNegInf;
        __m128i vE = vNegInf;
        __m128i vF = vNegInf;
        __m128i vJ = vJreset;
        const int * const restrict matrow0 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+0] : ((i+0 >= s1Len) ? s1Len-1 : i+0))];
        const int * const restrict matrow1 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+1] : ((i+1 >= s1Len) ? s1Len-1 : i+1))];
        const int * const restrict matrow2 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+2] : ((i+2 >= s1Len) ? s1Len-1 : i+2))];
        const int * const restrict matrow3 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+3] : ((i+3 >= s1Len) ? s1Len-1 : i+3))];
        vNH = _mm_srli_si128(vNH, 4);
        vNH = _mm_insert_epi32_rpl(vNH, H_pr[-1], 3);
        vWH = _mm_srli_si128(vWH, 4);
        vWH = _mm_insert_epi32_rpl(vWH, -open - i*gap, 3);
        H_pr[-1] = -open - (i+N)*gap;
        /* iterate over database sequence */
        for (j=0; j<s2Len+PAD; ++j) {
            __m128i vMat;
            __m128i vNWH = vNH;
            vNH = _mm_srli_si128(vWH, 4);
            vNH = _mm_insert_epi32_rpl(vNH, H_pr[j], 3);
            vF = _mm_srli_si128(vF, 4);
            vF = _mm_insert_epi32_rpl(vF, F_pr[j], 3);
            vF = _mm_max_epi32_rpl(
                    _mm_sub_epi32(vNH, vOpen),
                    _mm_sub_epi32(vF, vGap));
            vE = _mm_max_epi32_rpl(
                    _mm_sub_epi32(vWH, vOpen),
                    _mm_sub_epi32(vE, vGap));
            vMat = _mm_set_epi32(
                    matrow0[s2[j-0]],
                    matrow1[s2[j-1]],
                    matrow2[s2[j-2]],
                    matrow3[s2[j-3]]
                    );
            vNWH = _mm_add_epi32(vNWH, vMat);
            vWH = _mm_max_epi32_rpl(vNWH, vE);
            vWH = _mm_max_epi32_rpl(vWH, vF);
            /* as minor diagonal vector passes across the j=-1 boundary,
             * assign the appropriate boundary conditions */
            {
                __m128i cond = _mm_cmpeq_epi32(vJ,vNegOne);
                vWH = _mm_blendv_epi8_rpl(vWH, vIBoundary, cond);
                vF = _mm_blendv_epi8_rpl(vF, vNegInf, cond);
                vE = _mm_blendv_epi8_rpl(vE, vNegInf, cond);
            }
            /* cannot start checking sat until after J clears boundary */
            if (j > PAD) {
                vSaturationCheckMin = _mm_min_epi32_rpl(vSaturationCheckMin, vWH);
                vSaturationCheckMax = _mm_max_epi32_rpl(vSaturationCheckMax, vWH);
            }
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vWH, i, s1Len, j, s2Len);
#endif
#ifdef PARASAIL_ROWCOL
            arr_store_rowcol(result->rowcols->score_row, result->rowcols->score_col, vWH, i, s1Len, j, s2Len);
#endif
            H_pr[j-3] = (int32_t)_mm_extract_epi32_rpl(vWH,0);
            F_pr[j-3] = (int32_t)_mm_extract_epi32_rpl(vF,0);
            /* as minor diagonal vector passes across table, extract
               last table value at the i,j bound */
            {
                __m128i cond_valid_I = _mm_cmpeq_epi32(vI, vILimit1);
                __m128i cond_valid_J = _mm_cmpeq_epi32(vJ, vJLimit1);
                __m128i cond_all = _mm_and_si128(cond_valid_I, cond_valid_J);
                vMax = _mm_blendv_epi8_rpl(vMax, vWH, cond_all);
            }
            vJ = _mm_add_epi32(vJ, vOne);
        }
        vI = _mm_add_epi32(vI, vN);
        vIBoundary = _mm_sub_epi32(vIBoundary, vGapN);
    }

    /* max in vMax */
    for (i=0; i<N; ++i) {
        int32_t value;
        value = (int32_t) _mm_extract_epi32_rpl(vMax, 3);
        if (value > score) {
            score = value;
        }
        vMax = _mm_slli_si128(vMax, 4);
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi32(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi32(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(_F_pr);
    parasail_free(_H_pr);
    parasail_free(s2B);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        parasail_free(s1);
    }

    return result;
}